

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertUTF.cpp
# Opt level: O1

ConversionResult
convertUTF::ConvertUTF32toUTF16
          (UTF32 **sourceStart,UTF32 *sourceEnd,UTF16 **targetStart,UTF16 *targetEnd,
          ConversionFlags flags)

{
  uint uVar1;
  bool bVar2;
  ConversionResult CVar3;
  UTF16 *pUVar4;
  uint *puVar5;
  
  puVar5 = *sourceStart;
  pUVar4 = *targetStart;
  CVar3 = conversionOK;
  do {
    if (sourceEnd <= puVar5) break;
    if (targetEnd <= pUVar4) {
      CVar3 = targetExhausted;
      break;
    }
    uVar1 = *puVar5;
    if (uVar1 < 0x10000) {
      if ((uVar1 & 0xf800) != 0xd800) {
        *pUVar4 = (ushort)uVar1;
LAB_00182e71:
        pUVar4 = pUVar4 + 1;
        goto LAB_00182ead;
      }
      if (flags != strictConversion) {
        *pUVar4 = 0xfffd;
        goto LAB_00182e71;
      }
      CVar3 = sourceIllegal;
LAB_00182ebe:
      bVar2 = false;
    }
    else {
      if (uVar1 < 0x110000) {
        if (targetEnd <= pUVar4 + 1) {
          CVar3 = targetExhausted;
          goto LAB_00182ebe;
        }
        *pUVar4 = (short)(uVar1 + 0x3ff0000 >> 10) + 0xd800;
        pUVar4[1] = (ushort)uVar1 & 0x3ff | 0xdc00;
        pUVar4 = pUVar4 + 2;
      }
      else if (flags == strictConversion) {
        CVar3 = sourceIllegal;
      }
      else {
        *pUVar4 = 0xfffd;
        pUVar4 = pUVar4 + 1;
      }
LAB_00182ead:
      bVar2 = true;
      puVar5 = puVar5 + 1;
    }
  } while (bVar2);
  *sourceStart = puVar5;
  *targetStart = pUVar4;
  return CVar3;
}

Assistant:

ConversionResult ConvertUTF32toUTF16(const UTF32** sourceStart, const UTF32* sourceEnd, UTF16** targetStart,
                                     const UTF16* targetEnd, const ConversionFlags flags)
{
    ConversionResult result = ConversionResult::conversionOK;
    const UTF32* source = *sourceStart;
    UTF16* target = *targetStart;
    while (source < sourceEnd)
    {
        if (target >= targetEnd)
        {
            result = ConversionResult::targetExhausted;
            break;
        }
        UTF32 ch = *source++;
        if (ch <= UNI_MAX_BMP)
        { /* Target is a character <= 0xFFFF */
            /* UTF-16 surrogate values are illegal in UTF-32; 0xffff or 0xfffe are both reserved values */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END)
            {
                if (flags == ConversionFlags::strictConversion)
                {
                    --source; /* return to the illegal value itself */
                    result = ConversionResult::sourceIllegal;
                    break;
                }
                *target++ = UNI_REPLACEMENT_CHAR;
            }
            else
            {
                *target++ = static_cast<UTF16>(ch); /* normal case */
            }
        }
        else if (ch > UNI_MAX_LEGAL_UTF32)
        {
            if (flags == ConversionFlags::strictConversion)
            {
                result = ConversionResult::sourceIllegal;
            }
            else
            {
                *target++ = UNI_REPLACEMENT_CHAR;
            }
        }
        else
        {
            /* target is a character in range 0xFFFF - 0x10FFFF. */
            if (target + 1 >= targetEnd)
            {
                --source; /* Back up source pointer! */
                result = ConversionResult::targetExhausted;
                break;
            }
            ch -= halfBase;
            *target++ = static_cast<UTF16>((ch >> halfShift) + UNI_SUR_HIGH_START);
            *target++ = static_cast<UTF16>((ch & halfMask) + UNI_SUR_LOW_START);
        }
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}